

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_pack(REF_CELL ref_cell,REF_INT *o2n)

{
  size_t __size;
  int iVar1;
  REF_INT *pRVar2;
  bool bVar3;
  REF_STATUS RVar4;
  int iVar5;
  uint uVar6;
  REF_INT *pRVar7;
  REF_INT *sorted_index;
  void *__ptr;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  REF_INT RVar15;
  REF_INT nodes [27];
  uint local_c4;
  REF_INT local_a8;
  int local_a4 [29];
  
  iVar14 = ref_cell->max;
  if (iVar14 < 1) {
    iVar10 = 0;
  }
  else {
    RVar15 = 0;
    iVar10 = 0;
    do {
      RVar4 = ref_cell_nodes(ref_cell,RVar15,&local_a8);
      if (RVar4 == 0) {
        iVar14 = ref_cell->node_per;
        if (0 < iVar14) {
          pRVar7 = ref_cell->c2n;
          lVar12 = 0;
          do {
            pRVar7[(long)ref_cell->size_per * (long)iVar10 + lVar12] = o2n[(&local_a8)[lVar12]];
            lVar12 = lVar12 + 1;
            iVar14 = ref_cell->node_per;
          } while (lVar12 < iVar14);
        }
        if (ref_cell->last_node_is_an_id != 0) {
          ref_cell->c2n[iVar14 + ref_cell->size_per * iVar10] = (&local_a8)[iVar14];
        }
        iVar10 = iVar10 + 1;
      }
      RVar15 = RVar15 + 1;
      iVar14 = ref_cell->max;
    } while (RVar15 < iVar14);
  }
  iVar5 = ref_cell->n;
  if (iVar10 != iVar5) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x209,
           "ref_cell_pack","count is off",(long)iVar10,(long)iVar5);
    return 1;
  }
  RVar15 = -1;
  if (iVar5 < iVar14) {
    iVar14 = ref_cell->max;
    if (iVar5 < iVar14) {
      pRVar7 = ref_cell->c2n;
      do {
        lVar12 = (long)iVar5;
        pRVar7[ref_cell->size_per * lVar12] = -1;
        iVar5 = iVar5 + 1;
        pRVar7[ref_cell->size_per * lVar12 + 1] = iVar5;
        iVar14 = ref_cell->max;
      } while (iVar5 < iVar14);
    }
    ref_cell->c2n[((long)iVar14 + -1) * (long)ref_cell->size_per + 1] = -1;
    RVar15 = ref_cell->n;
  }
  ref_cell->blank = RVar15;
  iVar14 = ref_cell->n;
  if ((long)iVar14 < 0) {
    pcVar13 = "malloc key of REF_INT negative";
    uVar9 = 0x218;
LAB_001ab151:
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar9,
           "ref_cell_pack",pcVar13);
    local_c4 = 1;
  }
  else {
    __size = (long)iVar14 * 4;
    pRVar7 = (REF_INT *)malloc(__size);
    if (pRVar7 == (REF_INT *)0x0) {
      pcVar13 = "malloc key of REF_INT NULL";
      uVar9 = 0x218;
    }
    else {
      sorted_index = (REF_INT *)malloc(__size);
      if (sorted_index == (REF_INT *)0x0) {
        pcVar13 = "malloc order of REF_INT NULL";
        uVar9 = 0x219;
      }
      else {
        uVar6 = ref_cell->size_per * iVar14;
        if ((int)uVar6 < 0) {
          pcVar13 = "malloc c2n of REF_INT negative";
          uVar9 = 0x21b;
          goto LAB_001ab151;
        }
        __ptr = malloc((ulong)uVar6 << 2);
        if (__ptr != (void *)0x0) {
          iVar10 = ref_cell->max;
          if (0 < (long)iVar10) {
            lVar12 = 0;
            do {
              RVar4 = ref_cell_nodes(ref_cell,(REF_INT)lVar12,&local_a8);
              if (RVar4 == 0) {
                pRVar7[lVar12] = local_a8;
                iVar5 = ref_cell->node_per;
                if (1 < (long)iVar5) {
                  RVar15 = pRVar7[lVar12];
                  lVar8 = 1;
                  do {
                    iVar1 = (&local_a8)[lVar8];
                    if (iVar1 < RVar15) {
                      pRVar7[lVar12] = iVar1;
                      RVar15 = iVar1;
                    }
                    lVar8 = lVar8 + 1;
                  } while (iVar5 != lVar8);
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != iVar10);
          }
          local_c4 = ref_sort_heap_int(iVar14,pRVar7,sorted_index);
          if (local_c4 == 0) {
            local_c4 = 1;
            iVar14 = ref_cell->n;
            if (0 < (long)iVar14) {
              uVar6 = ref_cell->size_per;
              uVar11 = 0;
              lVar12 = 0;
              do {
                if (0 < (int)uVar6) {
                  memcpy((void *)((long)__ptr + (ulong)uVar11 * 4),
                         ref_cell->c2n + (long)sorted_index[lVar12] * (long)(int)uVar6,
                         (ulong)uVar6 << 2);
                }
                lVar12 = lVar12 + 1;
                uVar11 = uVar11 + uVar6;
              } while (iVar14 != lVar12);
            }
            if (0 < ref_cell->n) {
              iVar14 = 0;
              do {
                iVar10 = ref_cell->size_per;
                if (0 < iVar10) {
                  pRVar2 = ref_cell->c2n;
                  lVar12 = 0;
                  do {
                    lVar8 = iVar10 * iVar14 + lVar12;
                    pRVar2[lVar8] = *(REF_INT *)((long)__ptr + lVar8 * 4);
                    iVar10 = ref_cell->size_per;
                    lVar12 = lVar12 + 1;
                  } while ((int)lVar12 < iVar10);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < ref_cell->n);
            }
            free(__ptr);
            free(sorted_index);
            free(pRVar7);
            bVar3 = true;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x222,"ref_cell_pack",(ulong)local_c4,"sort smallest");
            bVar3 = false;
          }
          goto LAB_001ab205;
        }
        pcVar13 = "malloc c2n of REF_INT NULL";
        uVar9 = 0x21b;
      }
    }
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar9,
           "ref_cell_pack",pcVar13);
    local_c4 = 2;
  }
LAB_001ab205:
  if (bVar3) {
    local_c4 = ref_adj_free(ref_cell->ref_adj);
    if (local_c4 == 0) {
      local_c4 = ref_adj_create(&ref_cell->ref_adj);
      if (local_c4 == 0) {
        if (ref_cell->n < 1) {
          local_c4 = 0;
        }
        else {
          iVar14 = 0;
          do {
            if (0 < ref_cell->node_per) {
              lVar12 = 0;
              do {
                uVar6 = ref_adj_add(ref_cell->ref_adj,
                                    ref_cell->c2n[(long)ref_cell->size_per * (long)iVar14 + lVar12],
                                    iVar14);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x23b,"ref_cell_pack",(ulong)uVar6,"register cell");
                  return uVar6;
                }
                lVar12 = lVar12 + 1;
              } while ((int)lVar12 < ref_cell->node_per);
            }
            iVar14 = iVar14 + 1;
            local_c4 = 0;
          } while (iVar14 < ref_cell->n);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x235,"ref_cell_pack",(ulong)local_c4,"fresh ref_adj for ref_cell");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x234,
             "ref_cell_pack",(ulong)local_c4,"free adj");
    }
  }
  return local_c4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_pack(REF_CELL ref_cell, REF_INT *o2n) {
  REF_INT node, cell, compact;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  compact = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      ref_cell_c2n(ref_cell, node, compact) = o2n[nodes[node]];
    if (ref_cell_last_node_is_an_id(ref_cell))
      ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), compact) =
          nodes[ref_cell_node_per(ref_cell)];
    compact++;
  }
  REIS(compact, ref_cell_n(ref_cell), "count is off");

  if (ref_cell_n(ref_cell) < ref_cell_max(ref_cell)) {
    for (cell = ref_cell_n(ref_cell); cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = ref_cell_n(ref_cell);
  } else {
    ref_cell_blank(ref_cell) = REF_EMPTY;
  }

  {
    REF_INT *key, *order, *c2n;
    ref_malloc(key, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(order, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(c2n, ref_cell_size_per(ref_cell) * ref_cell_n(ref_cell),
               REF_INT);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      key[cell] = nodes[0];
      for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
        if (nodes[node] < key[cell]) key[cell] = nodes[node];
      }
    }
    RSS(ref_sort_heap_int(ref_cell_n(ref_cell), key, order), "sort smallest");
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        c2n[node + cell * ref_cell_size_per(ref_cell)] =
            ref_cell_c2n(ref_cell, node, order[cell]);
      }
    }
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        ref_cell_c2n(ref_cell, node, cell) =
            c2n[node + cell * ref_cell_size_per(ref_cell)];
      }
    }
    ref_free(c2n);
    ref_free(order);
    ref_free(key);
  }

  RSS(ref_adj_free(ref_cell_adj(ref_cell)), "free adj");
  RSS(ref_adj_create(&(ref_cell->ref_adj)), "fresh ref_adj for ref_cell");

  for (cell = 0; cell < ref_cell_n(ref_cell); cell++)
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      RSS(ref_adj_add(ref_cell_adj(ref_cell),
                      ref_cell_c2n(ref_cell, node, cell), cell),
          "register cell");

  return REF_SUCCESS;
}